

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPathEnum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint nSize;
  char *pcVar4;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  nSize = 4;
  do {
    while( true ) {
      do {
        iVar3 = Extra_UtilGetopt(argc,argv,"Nzvh");
        iVar2 = globalUtilOptind;
      } while (iVar3 == 0x7a);
      if (iVar3 < 0x68) break;
      if (iVar3 == 0x68) goto LAB_002698ed;
      if (iVar3 != 0x76) {
LAB_002698da:
        Abc_Print(-2,"Unknown switch.\n");
        goto LAB_002698ed;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) {
      Abc_EnumerateFrontierTest(nSize);
      return 0;
    }
    if (iVar3 != 0x4e) goto LAB_002698da;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      break;
    }
    nSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)nSize);
LAB_002698ed:
  Abc_Print(-2,"usage: pathenum [-N num] [-vh]\n");
  Abc_Print(-2,"\t         enumerates self-avoiding paths on the NxN grid\n");
  Abc_Print(-2,"\t-N num : the size of the grid to consider [default = %d]\n",(ulong)nSize);
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandPathEnum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_EnumerateFrontierTest( int nSize );
    int c, nSize = 4, fZddAlgo = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSize < 0 )
                goto usage;
            break;
        case 'z':
            fZddAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    Abc_EnumerateFrontierTest( nSize );
    return 0;

usage:
    Abc_Print( -2, "usage: pathenum [-N num] [-vh]\n" );
    Abc_Print( -2, "\t         enumerates self-avoiding paths on the NxN grid\n" );
    Abc_Print( -2, "\t-N num : the size of the grid to consider [default = %d]\n", nSize );
//    Abc_Print( -2, "\t-z     : toggle using ZDD-based algorithm [default = %s]\n", fZddAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}